

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O0

int hugeRead(void *context,char *buffer,int len)

{
  int iVar1;
  size_t sVar2;
  int local_24;
  int len_local;
  char *buffer_local;
  void *context_local;
  
  iVar1 = rlen;
  if (((context == (void *)0x0) || (buffer == (char *)0x0)) || (len < 0)) {
    context_local._4_4_ = -1;
  }
  else {
    local_24 = len;
    if (instate == 0) {
      if (len < rlen) {
        memcpy(buffer,current,(long)len);
        rlen = rlen - len;
        current = current + len;
      }
      else {
        local_24 = rlen;
        rlen = 0;
        memcpy(buffer,current,(long)iVar1);
        instate = 1;
        curlen = 0;
        dotlen = maxlen / 10;
      }
    }
    else if (instate == 2) {
      if (len < rlen) {
        memcpy(buffer,current,(long)len);
        rlen = rlen - len;
        current = current + len;
      }
      else {
        local_24 = rlen;
        rlen = 0;
        memcpy(buffer,current,(long)iVar1);
        instate = 3;
        curlen = 0;
      }
    }
    else if (instate == 1) {
      if (0x1000 < len) {
        local_24 = 0x1000;
      }
      memcpy(buffer,filling,(long)local_24);
      curlen = (long)local_24 + curlen;
      if (curlen < maxlen) {
        if (dotlen < curlen) {
          fprintf(_stderr,".");
          dotlen = maxlen / 10 + dotlen;
        }
      }
      else {
        sVar2 = strlen(hugeTests[currentTest].end);
        rlen = (int)sVar2;
        current = hugeTests[currentTest].end;
        instate = 2;
      }
    }
    else {
      local_24 = 0;
    }
    context_local._4_4_ = local_24;
  }
  return context_local._4_4_;
}

Assistant:

static int
hugeRead(void *context, char *buffer, int len)
{
    if ((context == NULL) || (buffer == NULL) || (len < 0))
        return (-1);

    if (instate == 0) {
        if (len >= rlen) {
            len = rlen;
            rlen = 0;
            memcpy(buffer, current, len);
            instate = 1;
            curlen = 0;
            dotlen = maxlen / 10;
        } else {
            memcpy(buffer, current, len);
            rlen -= len;
            current += len;
        }
    } else if (instate == 2) {
        if (len >= rlen) {
            len = rlen;
            rlen = 0;
            memcpy(buffer, current, len);
            instate = 3;
            curlen = 0;
        } else {
            memcpy(buffer, current, len);
            rlen -= len;
            current += len;
        }
    } else if (instate == 1) {
        if (len > CHUNK) len = CHUNK;
        memcpy(buffer, &filling[0], len);
        curlen += len;
        if (curlen >= maxlen) {
            rlen = strlen(hugeTests[currentTest].end);
            current = hugeTests[currentTest].end;
            instate = 2;
	} else {
            if (curlen > dotlen) {
                fprintf(stderr, ".");
                dotlen += maxlen / 10;
            }
        }
    } else
      len = 0;
    return (len);
}